

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void Centaurus::DFARoutineEM64T<unsigned_char>::emit_state
               (X86Assembler *as,Label *rejectlabel,DFAState<unsigned_char> *state,int index,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,MyConstPool *pool)

{
  byte bVar1;
  pointer pRVar2;
  NFATransition<unsigned_char> *pNVar3;
  iterator __position;
  pointer pNVar4;
  iterator __begin0;
  uint uVar5;
  uint32_t instId;
  Range<unsigned_char> *r;
  pointer pRVar6;
  uint o1;
  iterator __end0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  transitions;
  Label looplabel;
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  local_88;
  Operand_ *local_70;
  Operand_ *local_68;
  Operand_ *local_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_58;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  
  std::
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ::vector(&local_88,
           &(state->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_transitions);
  pNVar4 = local_88.
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_68 = (Operand_ *)(asmjit::x86OpData + 0x490);
    local_60 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
    local_70 = (Operand_ *)(asmjit::x86OpData + 0x490);
    pNVar4 = local_88.
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __position._M_current =
         local_88.
         super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((__position._M_current)->m_dest == index) && (state->m_long == true)) {
        local_48._packed[0] = (UInt64)0x210000149;
        local_48._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        MyConstPool::load_charclass_filter<unsigned_char>
                  (pool,(X86Xmm *)&local_48._any,&(__position._M_current)->m_label);
        (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_58,as);
        (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_58);
        local_98._packed[0] = (UInt64)0x32;
        local_98._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x191,(Operand_ *)(asmjit::x86OpData + 0x700),
                   (Operand_ *)&local_98._any);
        local_98._packed[0].i64 = (UInt64)0x3;
        local_98._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x14;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x1e1,(Operand_ *)(asmjit::x86OpData + 0x720),
                   (Operand_ *)(asmjit::x86OpData + 0x700),(Operand_ *)&local_98._any);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,7,local_60,local_68);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,local_70,0xf);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11a,(Operand_ *)&local_58._any);
        __position = std::
                     vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                     ::_M_erase(&local_88,__position);
        pNVar4 = local_88.
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current != pNVar4);
  }
  if (state->m_accept != false) {
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
               (Operand_ *)(asmjit::x86OpData + 0x4e0));
    pNVar4 = local_88.
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (local_88.
      super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pNVar4) {
    local_58._packed[0] = (UInt64)8.28907076174039e-317;
    local_58._any.reserved12_4 = 6;
    local_58._any.reserved8_4 = 0;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
               (Operand_ *)&local_58._any);
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x490),
               (Operand_ *)(asmjit::x86OpData + 0x480));
    asmjit::CodeEmitter::emit((CodeEmitter *)as,0x105,(Operand_ *)(asmjit::x86OpData + 0x4e0));
    pNVar3 = local_88.
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_88.
              super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.
              super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x38) {
      pRVar6 = ((local_88.
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pRVar2 = ((local_88.
                 super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)pRVar6 - (long)pRVar2 & 0xffffffff0U) == 0x10) {
        if (pRVar6 == pRVar2) {
          uVar5 = 0;
          o1 = 0;
LAB_0012a2da:
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),o1);
          instId = 0x121;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),uVar5 - o1);
        }
        else {
          o1 = (uint)pRVar2->m_start;
          uVar5 = (uint)pRVar2->m_end;
          if (pRVar2->m_start + 1 != (uint)pRVar2->m_end) goto LAB_0012a2da;
          instId = 0x124;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),o1);
        }
        asmjit::CodeEmitter::emit((CodeEmitter *)as,instId,(Operand_ *)rejectlabel);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x11e,
                   (Operand_ *)
                   ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                    _M_impl.super__Vector_impl_data._M_start +
                   (local_88.
                    super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_dest));
        goto LAB_0012a2b8;
      }
    }
    for (; pNVar3 != local_88.
                     super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pNVar3 = pNVar3 + 1) {
      pRVar2 = (pNVar3->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar6 = (pNVar3->m_label).m_ranges.
                    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar2; pRVar6 = pRVar6 + 1
          ) {
        bVar1 = pRVar6->m_start;
        if (bVar1 + 1 == (uint)pRVar6->m_end) {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x118,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar3->m_dest));
        }
        else {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                     (uint)pRVar6->m_end - (uint)pRVar6->m_start);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x115,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar3->m_dest));
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
                     (Operand_ *)(asmjit::x86OpData + 0x490));
        }
      }
    }
  }
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,(Operand_ *)rejectlabel);
LAB_0012a2b8:
  std::
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFAState<TCHAR>& state, int index, std::vector<asmjit::Label>& labels, MyConstPool& pool)
{
    std::vector<NFATransition<TCHAR> > transitions(state.get_transitions());

    for (auto i = transitions.begin(); i != transitions.end();)
    {
        if (i->dest() == index && state.is_long())
        {
            pool.load_charclass_filter(PATTERN2_REG, i->label());

            asmjit::Label looplabel = as.newLabel();

            as.bind(looplabel);

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(PATTERN2_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
            if (sizeof(TCHAR) == 2)
                as.sal(INDEX_REG, 1);
            as.add(INPUT_REG, INDEX_REG);
            as.cmp(INDEX_REG, 15);
            as.jg(looplabel);
            i = transitions.erase(i);
        }
        else
        {
            i++;
        }
    }

    if (state.is_accept_state())
        as.mov(BACKUP_REG, INPUT_REG);

    if (transitions.empty())
    {
        as.jmp(rejectlabel);
        return;
    }

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    if (transitions.size() == 1)
    {
        const NFATransition<TCHAR>& tr = transitions[0];

        if (tr.label().size() == 1)
        {
            const Range<TCHAR>& r = tr.label()[0];
            {
                if (r.start() + 1 == r.end())
                {
                    as.cmp(CHAR_REG, r.start());
                    as.jne(rejectlabel);
                }
                else
                {
                    as.sub(CHAR_REG, r.start());
                    as.cmp(CHAR_REG, r.end() - r.start());
                    as.jnb(rejectlabel);
                }
            }
            as.jmp(labels[tr.dest()]);

            return;
        }
    }
    for (const auto& tr : transitions)
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                //The range consists of one character: test for equality and jump
                as.cmp(CHAR_REG, r.start());
                as.je(labels[tr.dest()]);
            }
            else
            {
                //The range consists of multiple characters: range check and jump
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                as.jb(labels[tr.dest()]);
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    //Jump to the "reject trampoline" and check if the input has ever been accepted
    as.jmp(rejectlabel);
}